

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall ON_Xform::IsIdentity(ON_Xform *this,double zero_tolerance)

{
  long lVar1;
  
  if ((0.0 <= zero_tolerance) && (zero_tolerance < 1.23432101234321e+308)) {
    lVar1 = 0;
    while( true ) {
      if ((int)lVar1 == 0x78) {
        return ABS(1.0 - this->m_xform[3][3]) <= zero_tolerance;
      }
      if ((((zero_tolerance < ABS(1.0 - *(double *)((long)this->m_xform[0] + lVar1))) ||
           (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar1 + 8)))) ||
          (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar1 + 0x10)))) ||
         ((zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar1 + 0x18)) ||
          (zero_tolerance < ABS(*(double *)((long)this->m_xform[1] + lVar1)))))) break;
      lVar1 = lVar1 + 0x28;
    }
  }
  return false;
}

Assistant:

bool ON_Xform::IsIdentity( double zero_tolerance ) const
{
  // The code below will return false if m_xform[][] contains
  // a nan value.

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if ( !(fabs(1.0 - *v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
  }
  if ( !(fabs( 1.0 - *v ) <= zero_tolerance) )
    return false;

  return true;
}